

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

int __thiscall
TPZSkylMatrix<std::complex<double>_>::Subst_LForward
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  double *pdVar1;
  double *pdVar2;
  char cVar3;
  complex<double> **ppcVar4;
  complex<double> *pcVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  undefined4 extraout_var;
  int extraout_var_00;
  long lVar11;
  int iVar12;
  long lVar13;
  complex<double> *__z;
  long lVar14;
  complex<double> *pcVar15;
  long local_80;
  long local_70;
  double dStack_60;
  double local_58;
  double local_50;
  long local_48;
  TPZSkylMatrix<std::complex<double>_> *local_40;
  long local_38;
  
  lVar11 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  iVar10 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
             _vptr_TPZSavable[0xc])();
  iVar12 = 0;
  if ((lVar11 == CONCAT44(extraout_var,iVar10)) &&
     ((cVar3 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed,
      cVar3 == '\x04' || (cVar3 == '\x01')))) {
    iVar10 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
               _vptr_TPZSavable[0xc])(this);
    local_48 = CONCAT44(extraout_var_00,iVar10);
    iVar12 = 1;
    if (local_48 != 0 && -1 < extraout_var_00) {
      lVar11 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
      local_70 = -0x10;
      local_80 = 0;
      local_40 = this;
      do {
        if (0 < lVar11) {
          local_38 = local_80 << 4;
          lVar14 = 0;
          lVar13 = 0;
          do {
            ppcVar4 = (this->fElem).fStore;
            pcVar5 = ppcVar4[local_80 + 1];
            lVar11 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
            if (lVar11 <= local_80) {
              TPZFMatrix<std::complex<double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pcVar15 = ppcVar4[local_80] + 1;
            dVar7 = 0.0;
            dStack_60 = 0.0;
            dVar8 = 0.0;
            dVar9 = 0.0;
            if (pcVar15 < pcVar5) {
              __z = (complex<double> *)(B->fElem->_M_value + lVar11 * lVar14 + local_70);
              do {
                auVar6._8_4_ = SUB84(dStack_60,0);
                auVar6._0_8_ = dVar7;
                auVar6._12_4_ = (int)((ulong)dStack_60 >> 0x20);
                local_58 = *(double *)pcVar15->_M_value;
                local_50 = -*(double *)(pcVar15->_M_value + 8);
                std::complex<double>::operator*=((complex<double> *)&local_58,__z);
                dStack_60 = auVar6._8_8_;
                dVar7 = dVar7 + local_58;
                dStack_60 = dStack_60 + local_50;
                pcVar15 = pcVar15 + 1;
                __z = __z + -1;
              } while (pcVar15 < pcVar5);
              lVar11 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
              dVar8 = dVar7;
              dVar9 = dStack_60;
            }
            if ((lVar11 <= local_80) ||
               ((B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= lVar13)) {
              TPZFMatrix<std::complex<double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pdVar1 = (double *)(B->fElem[lVar11 * lVar13]._M_value + local_38);
            dVar7 = pdVar1[1];
            pdVar2 = (double *)(B->fElem[lVar11 * lVar13]._M_value + local_38);
            *pdVar2 = *pdVar1 - dVar8;
            pdVar2[1] = dVar7 - dVar9;
            lVar13 = lVar13 + 1;
            lVar11 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
            lVar14 = lVar14 + 0x10;
            this = local_40;
          } while (lVar13 < lVar11);
        }
        local_80 = local_80 + 1;
        local_70 = local_70 + 0x10;
      } while (local_80 != local_48);
      iVar12 = 1;
    }
  }
  return iVar12;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_LForward( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != this->Dim()) || (this->fDecomposed != ELDLt && this->fDecomposed != ELU) )
        return( 0 );
    
    int64_t dimension =this->Dim();
    for ( int64_t k = 0; k < dimension; k++ ) {
        for ( int64_t j = 0; j < B->Cols(); j++ ) {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar sum = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar *BPtr = &(*B)(k,j);
            if constexpr(is_complex<TVar>::value)
                while(elem_ki < end_ki) sum += std::conj(*elem_ki++) * (*--BPtr);//(*BPtr--)
            else
                while(elem_ki < end_ki) sum += (*elem_ki++) * (*--BPtr);//(*BPtr--)
            
            // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
            //
            //	B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
            BPtr = &(*B)(k,j);
            *BPtr-= sum;
        }
    }
    return( 1 );
}